

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

hashnode * get_hashnode(hashtable *table,void *label,_Bool *is_find)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  hashnode *phVar4;
  hashnode *phVar5;
  
  uVar3 = (*table->hash)(label);
  uVar1 = (ulong)uVar3 % (ulong)(uint)table->size;
  if (table->nodes[uVar1].record != (void *)0x0) {
    printf("error!");
    exit(0);
  }
  phVar4 = table->nodes + uVar1;
  do {
    phVar5 = phVar4->next;
    if (phVar5 == (hashnode *)0x0) {
      if (is_find == (_Bool *)0x0) {
        return phVar4;
      }
      _Var2 = false;
      phVar5 = phVar4;
      goto LAB_001026f0;
    }
    _Var2 = (*table->compare)(phVar5->record,label);
    phVar4 = phVar5;
  } while (!_Var2);
  _Var2 = true;
  if (is_find != (_Bool *)0x0) {
LAB_001026f0:
    *is_find = _Var2;
  }
  return phVar5;
}

Assistant:

hashnode* get_hashnode(hashtable* table,void *label,bool*is_find){
  // #if DEBUG == 1

  // int count =0;
  // #endif

  unsigned pos = table->hash(label) % table->size;
  hashnode * node= &table->nodes[pos],*last;
  // printf("pos=%d\n",pos);
  if((struct record*)node->record){
    printf("error!");
    exit(0);
  }
  // printf(" has next %d\n",node->next);
  while (node->next) { //头结点
    last = node;
    node = node->next;
    // printf("check %lld\n",node->record);
    if (table->compare(node->record,label)) {
       if (is_find){
         *is_find = 1;
       }
       return node;
    }
  }
  if (is_find)
    *is_find = 0;
  return node;
}